

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spcdas.cpp
# Opt level: O2

void disas(byte o,char *s,byte a,byte b,byte c,byte d)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  char *__format;
  undefined3 in_register_00000089;
  int iVar12;
  int iVar13;
  uint local_1078;
  char t [16];
  char ws [4096];
  
  local_1078 = CONCAT31(in_register_00000089,d);
  if (spc.addr) {
    sprintf(ws,"%04x: ",(ulong)spc.pc);
  }
  else {
    ws[0] = '\0';
  }
  uVar2 = (uint)o;
  if (spc.hex == true) {
    for (lVar11 = 9; (int)lVar11 - uVar2 != 9; lVar11 = lVar11 + 1) {
      sprintf(t,"%02x ",(ulong)spc.mem[(ulong)spc.pc + lVar11 + -9]);
      strcat(ws,t);
    }
    for (uVar9 = uVar2; sVar5 = strlen(ws), uVar9 < 3; uVar9 = uVar9 + 1) {
      builtin_strncpy(ws + sVar5,"   ",4);
    }
    (ws + sVar5)[0] = ' ';
    (ws + sVar5)[1] = '\0';
  }
  sVar5 = strlen(ws);
  uVar9 = (uint)c;
  iVar10 = 0;
  iVar13 = 0;
  do {
    sVar6 = strlen(s);
    iVar12 = (int)sVar5;
    if ((int)sVar6 <= iVar10) {
      ws[iVar12] = '\0';
      fprintf((FILE *)wr,"%s\r\n",ws);
      spc.pc = spc.pc + o;
      return;
    }
    if (s[iVar10] == '*') {
      cVar1 = s[(long)iVar10 + 1];
      if (cVar1 == 'w') {
        uVar8 = (ulong)local_1078;
        uVar3 = (uint)a;
        switch(iVar13) {
        case 0:
          break;
        case 1:
          uVar3 = (uint)b;
          break;
        case 2:
          uVar3 = uVar9;
          break;
        case 3:
          uVar3 = (uint)d;
          break;
        default:
          goto switchD_0010142f_default;
        }
        uVar8 = (ulong)*(ushort *)(spc.mem + (ulong)uVar3 + (ulong)spc.pc);
switchD_0010142f_default:
LAB_00101526:
        local_1078 = (uint)uVar8;
        uVar8 = uVar8 & 0xffff;
        __format = "%04x";
LAB_00101536:
        iVar13 = iVar13 + 1;
        sprintf(t,__format,uVar8);
      }
      else if (cVar1 == 'm') {
        uVar3 = (uint)a;
        switch(iVar13) {
        case 0:
          break;
        case 1:
          uVar3 = (uint)b;
          break;
        case 2:
          uVar3 = uVar9;
          break;
        case 3:
          uVar3 = (uint)d;
          break;
        default:
          goto switchD_001013d5_default;
        }
        local_1078 = (uint)*(ushort *)(spc.mem + (ulong)uVar3 + (ulong)spc.pc);
switchD_001013d5_default:
        iVar13 = iVar13 + 1;
        sprintf(t,"%04x,%d",(ulong)(local_1078 & 0x1fff),(ulong)(local_1078 >> 0xd));
      }
      else {
        if (cVar1 == 'r') {
          uVar8 = (ulong)local_1078;
          uVar7 = (ulong)a;
          switch(iVar13) {
          case 0:
            break;
          case 1:
            uVar7 = (ulong)b;
            break;
          case 2:
            uVar7 = (ulong)uVar9;
            break;
          case 3:
            uVar7 = (ulong)d;
            break;
          default:
            goto switchD_001013fe_default;
          }
          uVar8 = (ulong)spc.mem[spc.pc + uVar7];
switchD_001013fe_default:
          if (spc.rel != true) goto LAB_001014f4;
          uVar8 = (ulong)((int)(char)uVar8 + uVar2 + (uint)spc.pc);
          goto LAB_00101526;
        }
        if (cVar1 == 'b') {
          uVar8 = (ulong)local_1078;
          uVar7 = (ulong)a;
          switch(iVar13) {
          case 0:
            break;
          case 1:
            uVar7 = (ulong)b;
            break;
          case 2:
            uVar7 = (ulong)uVar9;
            break;
          case 3:
            uVar7 = (ulong)d;
            break;
          default:
            goto switchD_0010139c_default;
          }
          uVar8 = (ulong)spc.mem[spc.pc + uVar7];
switchD_0010139c_default:
LAB_001014f4:
          local_1078 = (uint)uVar8;
          uVar8 = uVar8 & 0xff;
          __format = "%02x";
          goto LAB_00101536;
        }
      }
      iVar10 = iVar10 + 1;
      ws[iVar12] = '\0';
      strcat(ws,t);
      sVar5 = strlen(t);
      iVar4 = (int)sVar5;
    }
    else {
      ws[iVar12] = s[iVar10];
      iVar4 = 1;
    }
    iVar10 = iVar10 + 1;
    sVar5 = (size_t)(uint)(iVar4 + iVar12);
  } while( true );
}

Assistant:

void disas(byte o, const char *s, byte a = 0, byte b = 0, byte c = 0, byte d = 0) {
char ws[4096], t[16];
int i, x, pos = 0, z;
uint v;
  if(spc.addr == true) {
    sprintf(ws, "%04x: ", spc.pc);
  } else {
    strcpy(ws, "");
  }
  if(spc.hex == true) {
    for(i=0;i<o;i++) {
      sprintf(t, "%02x ", spc.mem[spc.pc+i]);
      strcat(ws, t);
    }
    for(;i<3;i++) {
      strcat(ws, "   ");
    }
    strcat(ws, " ");
  }
  z=strlen(ws);
  for(i=0;i<(int)strlen(s);i++) {
    if(s[i]=='*') {
      x=s[++i];
      if(x=='b') {
        if     (pos == 0)v=spc.mem[spc.pc+a];
        else if(pos == 1)v=spc.mem[spc.pc+b];
        else if(pos == 2)v=spc.mem[spc.pc+c];
        else if(pos == 3)v=spc.mem[spc.pc+d];
        pos++;
        sprintf(t, "%02x", v&0xff);
      } else if(x=='w') {
        if     (pos == 0)v=spc.mem[spc.pc+a]|(spc.mem[spc.pc+a+1]<<8);
        else if(pos == 1)v=spc.mem[spc.pc+b]|(spc.mem[spc.pc+b+1]<<8);
        else if(pos == 2)v=spc.mem[spc.pc+c]|(spc.mem[spc.pc+c+1]<<8);
        else if(pos == 3)v=spc.mem[spc.pc+d]|(spc.mem[spc.pc+d+1]<<8);
        pos++;
        sprintf(t, "%04x", v&0xffff);
      } else if(x=='m') {
        if     (pos == 0)v=spc.mem[spc.pc+a]|(spc.mem[spc.pc+a+1]<<8);
        else if(pos == 1)v=spc.mem[spc.pc+b]|(spc.mem[spc.pc+b+1]<<8);
        else if(pos == 2)v=spc.mem[spc.pc+c]|(spc.mem[spc.pc+c+1]<<8);
        else if(pos == 3)v=spc.mem[spc.pc+d]|(spc.mem[spc.pc+d+1]<<8);
        pos++;
        sprintf(t, "%04x,%d", v&0x1fff, v>>13);
      } else if(x=='r') {
        if     (pos == 0)v=spc.mem[spc.pc+a];
        else if(pos == 1)v=spc.mem[spc.pc+b];
        else if(pos == 2)v=spc.mem[spc.pc+c];
        else if(pos == 3)v=spc.mem[spc.pc+d];
        pos++;
        if(spc.rel == true) {
          v=(spc.pc+o)+(signed char)v;
          sprintf(t, "%04x", v&0xffff);
        } else {
          sprintf(t, "%02x", v&0xff);
        }
      }
      ws[z]=0;
      strcat(ws, t);
      z+=strlen(t);
    } else {
      ws[z++]=s[i];
    }
  }
  ws[z]=0;
  fprintf(wr, "%s\r\n", ws);

  spc.pc+=o;
}